

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

int __thiscall Polynomial::createNotNode(Polynomial *this,int first_loc)

{
  int iVar1;
  initializer_list<int> __l;
  allocator_type local_51;
  operand local_50;
  vector<int,_std::allocator<int>_> args;
  
  this->mResultLocation =
       (int)((ulong)((long)(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_50;
  local_50.op = first_loc;
  std::vector<int,_std::allocator<int>_>::vector(&args,__l,&local_51);
  local_50.op = NOT;
  Catch::clara::std::vector<int,_std::allocator<int>_>::vector
            (&local_50.args,(vector<int,_std::allocator<int>_> *)&args);
  std::vector<Polynomial::operand,_std::allocator<Polynomial::operand>_>::
  emplace_back<Polynomial::operand>
            ((vector<Polynomial::operand,_std::allocator<Polynomial::operand>_> *)&this->mOperands,
             &local_50);
  Catch::clara::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_50.args.super__Vector_base<int,_std::allocator<int>_>);
  local_50.op = PLUS;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&this->mEvaluationValues,(int *)&local_50);
  iVar1 = this->mResultLocation;
  Catch::clara::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&args);
  return iVar1;
}

Assistant:

int Polynomial::createNotNode(int first_loc)
{
  mResultLocation = mEvaluationValues.size();
  std::vector<int> args { first_loc };
  mOperands.push_back({operandType::NOT, args});
  mEvaluationValues.push_back(0); // make space in evaluation array for the output.
  return mResultLocation;
}